

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  int in_ECX;
  Trigger *in_RSI;
  long in_RDI;
  bool bVar1;
  TriggerPrg *pPrg;
  Parse *pRoot;
  Table *in_stack_00000048;
  Trigger *in_stack_00000050;
  Parse *in_stack_00000058;
  long local_38;
  TriggerPrg *local_30;
  
  local_38 = in_RDI;
  if (*(long *)(in_RDI + 0x1c0) != 0) {
    local_38 = *(long *)(in_RDI + 0x1c0);
  }
  local_30 = *(TriggerPrg **)(local_38 + 0x278);
  while( true ) {
    bVar1 = false;
    if ((local_30 != (TriggerPrg *)0x0) && (bVar1 = true, local_30->pTrigger == in_RSI)) {
      bVar1 = local_30->orconf != in_ECX;
    }
    if (!bVar1) break;
    local_30 = local_30->pNext;
  }
  if (local_30 == (TriggerPrg *)0x0) {
    local_30 = codeRowTrigger(in_stack_00000058,in_stack_00000050,in_stack_00000048,pParse._4_4_);
  }
  return local_30;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}